

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfsm-builder.cc
# Opt level: O0

void __thiscall
cnn::ClassFactoredSoftmaxBuilder::new_graph(ClassFactoredSoftmaxBuilder *this,ComputationGraph *cg)

{
  ComputationGraph *in_RSI;
  Expression *in_RDI;
  uint num_clusters;
  Expression *in_stack_ffffffffffffffb8;
  Parameters *in_stack_ffffffffffffffd0;
  ComputationGraph *in_stack_ffffffffffffffd8;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *in_stack_ffffffffffffffe0;
  
  in_RDI[0x11].pg = in_RSI;
  Dict::size((Dict *)0x5b12bd);
  cnn::expr::parameter(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  cnn::expr::Expression::operator=(in_RDI,in_stack_ffffffffffffffb8);
  cnn::expr::parameter(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  cnn::expr::Expression::operator=(in_RDI,in_stack_ffffffffffffffb8);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::clear
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)0x5b1336);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::clear
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)0x5b1347);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
            (in_stack_ffffffffffffffe0,(size_type)in_stack_ffffffffffffffd8);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
            (in_stack_ffffffffffffffe0,(size_type)in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void ClassFactoredSoftmaxBuilder::new_graph(ComputationGraph& cg) {
  pcg = &cg;
  const unsigned num_clusters = cdict.size();
  r2c = parameter(cg, p_r2c);
  cbias = parameter(cg, p_cbias);
  rc2ws.clear();
  rc2biases.clear();
  rc2ws.resize(num_clusters);
  rc2biases.resize(num_clusters);
}